

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto_ReservedRange::Clear(DescriptorProto_ReservedRange *this)

{
  DescriptorProto_ReservedRange *this_local;
  
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    memset(&this->start_,0,8);
  }
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void DescriptorProto_ReservedRange::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.DescriptorProto.ReservedRange)
  if (_has_bits_[0 / 32] & 3u) {
    ::memset(&start_, 0, reinterpret_cast<char*>(&end_) -
      reinterpret_cast<char*>(&start_) + sizeof(end_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}